

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void av1_write_obu_tg_tile_headers
               (AV1_COMP *cpi,MACROBLOCKD *xd,PackBSParams *pack_bs_params,int tile_idx)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  aom_write_bit_buffer local_40;
  
  iVar7 = (cpi->common).tiles.cols;
  iVar1 = (cpi->common).tiles.rows;
  iVar2 = cpi->num_tg;
  uVar3 = av1_write_obu_header
                    (&cpi->ppi->level_params,&cpi->frame_header_count,
                     (iVar2 == 1) * '\x02' + OBU_TILE_GROUP,
                     ((cpi->common).seq_params)->has_nonzero_operating_point_idc,true,
                     (uint)pack_bs_params->obu_extn_header,pack_bs_params->tile_data_curr);
  pack_bs_params->curr_tg_hdr_size = uVar3;
  pack_bs_params->obu_header_size = uVar3;
  iVar6 = cpi->num_tg;
  if (iVar6 == 1) {
    uVar3 = write_frame_header_obu
                      (cpi,xd,pack_bs_params->saved_wb,pack_bs_params->tile_data_curr + uVar3,0);
    uVar3 = uVar3 + pack_bs_params->curr_tg_hdr_size;
    pack_bs_params->curr_tg_hdr_size = uVar3;
    iVar6 = cpi->num_tg;
  }
  iVar5 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  iVar7 = (iVar7 * iVar1 + iVar2 + -1) / iVar2 + tile_idx;
  if (iVar7 < iVar5) {
    iVar5 = iVar7;
  }
  local_40.bit_buffer = pack_bs_params->tile_data_curr + (int)uVar3;
  local_40.bit_offset = 0;
  iVar7 = (cpi->common).tiles.log2_rows + (cpi->common).tiles.log2_cols;
  if (iVar7 == 0) {
    uVar4 = 0;
  }
  else {
    aom_wb_write_bit(&local_40,(uint)(1 < iVar6));
    if (1 < iVar6) {
      aom_wb_write_literal(&local_40,tile_idx,iVar7);
      aom_wb_write_literal(&local_40,iVar5 + -1,iVar7);
    }
    uVar4 = aom_wb_bytes_written(&local_40);
    uVar3 = pack_bs_params->curr_tg_hdr_size;
  }
  pack_bs_params->curr_tg_hdr_size = uVar3 + uVar4;
  *pack_bs_params->total_size = *pack_bs_params->total_size + uVar3 + uVar4;
  return;
}

Assistant:

void av1_write_obu_tg_tile_headers(AV1_COMP *const cpi, MACROBLOCKD *const xd,
                                   PackBSParams *const pack_bs_params,
                                   const int tile_idx) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  int *const curr_tg_hdr_size = &pack_bs_params->curr_tg_hdr_size;
  const int tg_size =
      (tiles->rows * tiles->cols + cpi->num_tg - 1) / cpi->num_tg;

  // Write Tile group, frame and OBU header
  // A new tile group begins at this tile.  Write the obu header and
  // tile group header
  const OBU_TYPE obu_type = (cpi->num_tg == 1) ? OBU_FRAME : OBU_TILE_GROUP;
  *curr_tg_hdr_size = av1_write_obu_header(
      &cpi->ppi->level_params, &cpi->frame_header_count, obu_type,
      cm->seq_params->has_nonzero_operating_point_idc,
      /*is_layer_specific_obu=*/true, pack_bs_params->obu_extn_header,
      pack_bs_params->tile_data_curr);
  pack_bs_params->obu_header_size = *curr_tg_hdr_size;

  if (cpi->num_tg == 1)
    *curr_tg_hdr_size += write_frame_header_obu(
        cpi, xd, pack_bs_params->saved_wb,
        pack_bs_params->tile_data_curr + *curr_tg_hdr_size, 0);
  *curr_tg_hdr_size += write_tile_group_header(
      pack_bs_params->tile_data_curr + *curr_tg_hdr_size, tile_idx,
      AOMMIN(tile_idx + tg_size - 1, tiles->cols * tiles->rows - 1),
      (tiles->log2_rows + tiles->log2_cols), cpi->num_tg > 1);
  *pack_bs_params->total_size += *curr_tg_hdr_size;
}